

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O2

bool openZoneInfo(QString *name,QFile *file)

{
  bool bVar1;
  int iVar2;
  long in_FS_OFFSET;
  QStringBuilder<const_QLatin1String_&,_const_QString_&> local_90;
  QLatin1StringView zoneLib;
  QLatin1StringView zoneShare;
  QArrayDataPointer<char16_t> local_60;
  QArrayDataPointer<char16_t> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  qEnvironmentVariable((QString *)&local_48,"TZDIR");
  if ((undefined1 *)local_48.size != (undefined1 *)0x0) {
    QDir::QDir((QDir *)&zoneShare,(QString *)&local_48);
    QDir::filePath((QString *)&local_60,(QDir *)&zoneShare,name);
    QFile::setFileName(file,(QString *)&local_60);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
    QDir::~QDir((QDir *)&zoneShare);
    iVar2 = (*(file->super_QFileDevice).super_QIODevice.super_QObject._vptr_QObject[0xd])(file,1);
    bVar1 = true;
    if ((char)iVar2 != '\0') goto LAB_003b1cc9;
  }
  zoneShare.m_size = 0x14;
  zoneShare.m_data = "/usr/share/zoneinfo/";
  bVar1 = operator!=((QString *)&local_48,&zoneShare);
  if (bVar1) {
    local_60.d = (Data *)(zoneShare.m_size + -1);
    local_60.ptr = (char16_t *)zoneShare.m_data;
    bVar1 = operator!=((QString *)&local_48,(QLatin1StringView *)&local_60);
    if (bVar1) {
      zoneLib.m_size = (qsizetype)&zoneShare;
      zoneLib.m_data = (char *)name;
      QStringBuilder<const_QLatin1String_&,_const_QString_&>::convertTo<QString>
                ((QString *)&local_60,
                 (QStringBuilder<const_QLatin1String_&,_const_QString_&> *)&zoneLib);
      QFile::setFileName(file,(QString *)&local_60);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
      iVar2 = (*(file->super_QFileDevice).super_QIODevice.super_QObject._vptr_QObject[0xd])(file,1);
      bVar1 = true;
      if ((char)iVar2 != '\0') goto LAB_003b1cc9;
    }
  }
  zoneLib.m_size = 0x12;
  zoneLib.m_data = "/usr/lib/zoneinfo/";
  bVar1 = operator!=((QString *)&local_48,&zoneLib);
  if (bVar1) {
    local_60.d = (Data *)(zoneLib.m_size + -1);
    local_60.ptr = (char16_t *)zoneLib.m_data;
    bVar1 = operator!=((QString *)&local_48,(QLatin1StringView *)&local_60);
    if (bVar1) {
      local_90.a = &zoneShare;
      local_90.b = name;
      QStringBuilder<const_QLatin1String_&,_const_QString_&>::convertTo<QString>
                ((QString *)&local_60,&local_90);
      QFile::setFileName(file,(QString *)&local_60);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
      iVar2 = (*(file->super_QFileDevice).super_QIODevice.super_QObject._vptr_QObject[0xd])(file,1);
      bVar1 = true;
      if ((char)iVar2 != '\0') goto LAB_003b1cc9;
    }
  }
  bVar1 = false;
LAB_003b1cc9:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

static bool openZoneInfo(const QString &name, QFile *file)
{
    // At least on Linux / glibc (see man 3 tzset), $TZDIR overrides the system
    // default location for zone info:
    const QString tzdir = qEnvironmentVariable("TZDIR");
    if (!tzdir.isEmpty()) {
        file->setFileName(QDir(tzdir).filePath(name));
        if (file->open(QIODevice::ReadOnly))
            return true;
    }
    // Try modern system path first:
    constexpr auto zoneShare = "/usr/share/zoneinfo/"_L1;
    if (tzdir != zoneShare && tzdir != zoneShare.chopped(1)) {
        file->setFileName(zoneShare + name);
        if (file->open(QIODevice::ReadOnly))
            return true;
    }
    // Fall back to legacy system path:
    constexpr auto zoneLib = "/usr/lib/zoneinfo/"_L1;
    if (tzdir != zoneLib && tzdir != zoneLib.chopped(1)) {
        file->setFileName(zoneShare + name);
        if (file->open(QIODevice::ReadOnly))
            return true;
    }
    return false;
}